

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void cmGlobalNinjaGenerator::WriteInclude(ostream *os,string *filename,string *comment)

{
  ostream *poVar1;
  
  WriteComment(os,comment);
  poVar1 = std::operator<<(os,"include ");
  poVar1 = std::operator<<(poVar1,(string *)filename);
  std::operator<<(poVar1,"\n");
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteInclude(std::ostream& os,
                                          const std::string& filename,
                                          const std::string& comment)
{
  cmGlobalNinjaGenerator::WriteComment(os, comment);
  os << "include " << filename << "\n";
}